

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O1

Bool GetParsePickListValue(TidyDocImpl *doc,TidyOptionImpl *entry,uint *result)

{
  StreamIn *in;
  PickListItems *paPVar1;
  ctmbstr ptVar2;
  uint uVar3;
  Bool BVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  tmbchar work [16];
  tmbchar local_48 [24];
  
  uVar3 = SkipWhite(&doc->config);
  local_48[0] = '\0';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  local_48[8] = '\0';
  local_48[9] = '\0';
  local_48[10] = '\0';
  local_48[0xb] = '\0';
  local_48[0xc] = '\0';
  local_48[0xd] = '\0';
  local_48[0xe] = '\0';
  local_48[0xf] = '\0';
  if (uVar3 != 0xffffffff) {
    uVar7 = 0;
    while( true ) {
      BVar4 = prvTidyIsWhite(uVar3);
      if (((BVar4 != no) || (uVar3 == 10)) || (uVar3 == 0xd)) break;
      local_48[uVar7] = (tmbchar)uVar3;
      if ((doc->config).c != 0xffffffff) {
        in = (doc->config).cfgIn;
        if (in == (StreamIn *)0x0) {
          uVar3 = 0xffffffff;
        }
        else {
          uVar3 = prvTidyReadChar(in);
        }
        (doc->config).c = uVar3;
      }
      uVar3 = (doc->config).c;
      if ((uVar3 == 0xffffffff) || (bVar8 = 0xe < uVar7, uVar7 = uVar7 + 1, bVar8)) break;
    }
  }
  paPVar1 = entry->pickList;
  if (paPVar1 == (PickListItems *)0x0) {
LAB_0013548c:
    prvTidyReportBadArgument(doc,entry->name);
    BVar4 = no;
  }
  else {
    uVar7 = 0;
    do {
      if ((*paPVar1)[uVar7].label == (ctmbstr)0x0) goto LAB_0013548c;
      ptVar2 = (*paPVar1)[uVar7].inputs[0];
      bVar8 = ptVar2 == (ctmbstr)0x0;
      if (bVar8) {
LAB_0013547e:
        uVar7 = (ulong)((uint)uVar7 + 1);
      }
      else {
        iVar5 = prvTidytmbstrcasecmp(local_48,ptVar2);
        if (iVar5 != 0) {
          uVar6 = 1;
          do {
            ptVar2 = (*paPVar1)[uVar7].inputs[uVar6];
            bVar8 = ptVar2 == (ctmbstr)0x0;
            if (bVar8) goto LAB_0013547e;
            iVar5 = prvTidytmbstrcasecmp(local_48,ptVar2);
            uVar6 = (ulong)((int)uVar6 + 1);
          } while (iVar5 != 0);
        }
        *result = (uint)uVar7;
      }
    } while (bVar8);
    BVar4 = yes;
  }
  return BVar4;
}

Assistant:

static Bool GetParsePickListValue( TidyDocImpl* doc, const TidyOptionImpl* entry, uint *result )
{
    TidyConfigImpl* cfg = &doc->config;
    tchar c = SkipWhite( cfg );
    tmbchar work[ 16 ] = {0};
    tmbstr cp = work, end = work + sizeof(work);

    while ( c!=EndOfStream && cp < end && !TY_(IsWhite)(c) && c != '\r' && c != '\n' )
    {
        *cp++ = (tmbchar) c;
        c = AdvanceChar( cfg );
    }

    if ( GetPickListValue( work, entry->pickList, result ) != yes )
    {
        TY_(ReportBadArgument)( doc, entry->name );
        return no;
    }

    return yes;
}